

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printResultType(AssertionPrinter *this)

{
  ostream *poVar1;
  Colour colourGuard;
  Colour local_9;
  
  if ((this->passOrFail)._M_string_length != 0) {
    Colour::Colour(&local_9,this->colour);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->stream,(this->passOrFail)._M_dataplus._M_p,
                        (this->passOrFail)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":\n",2);
    Colour::~Colour(&local_9);
  }
  return;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) >= opCast( rhs );
        }